

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleARGBRowDown2_C(uint8_t *src_argb,ptrdiff_t src_stride,uint8_t *dst_argb,int dst_width)

{
  int x;
  uint32_t *dst;
  uint32_t *src;
  int dst_width_local;
  uint8_t *dst_argb_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_argb_local;
  
  dst = (uint32_t *)dst_argb;
  src = (uint32_t *)src_argb;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst = src[1];
    dst[1] = src[3];
    src = src + 4;
    dst = dst + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst = src[1];
  }
  return;
}

Assistant:

void ScaleARGBRowDown2_C(const uint8_t* src_argb,
                         ptrdiff_t src_stride,
                         uint8_t* dst_argb,
                         int dst_width) {
  const uint32_t* src = (const uint32_t*)(src_argb);
  uint32_t* dst = (uint32_t*)(dst_argb);
  int x;
  (void)src_stride;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = src[1];
    dst[1] = src[3];
    src += 4;
    dst += 2;
  }
  if (dst_width & 1) {
    dst[0] = src[1];
  }
}